

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrtarga.c
# Opt level: O0

void write_header(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,int num_colors)

{
  size_t sVar1;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  char targaheader [18];
  undefined1 uStack_28;
  undefined1 local_27;
  undefined1 local_26;
  undefined1 local_23;
  undefined1 local_22;
  undefined1 local_21;
  undefined1 local_1c;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  undefined1 local_18;
  undefined1 local_17;
  int local_14;
  long local_10;
  long *local_8;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&uStack_28,0,0x12);
  if (0 < local_14) {
    local_27 = 1;
    local_23 = (undefined1)local_14;
    local_22 = (undefined1)((uint)local_14 >> 8);
    local_21 = 0x18;
  }
  local_1c = (undefined1)(int)local_8[0x11];
  local_1b = (undefined1)((uint)(int)local_8[0x11] >> 8);
  local_1a = (undefined1)*(undefined4 *)((long)local_8 + 0x8c);
  local_19 = (undefined1)((uint)*(undefined4 *)((long)local_8 + 0x8c) >> 8);
  local_17 = 0x20;
  if ((int)local_8[8] == 1) {
    local_26 = 3;
    local_18 = 8;
  }
  else if (local_14 < 1) {
    local_26 = 2;
    local_18 = 0x18;
  }
  else {
    local_26 = 1;
    local_18 = 8;
  }
  sVar1 = fwrite(&uStack_28,1,0x12,*(FILE **)(local_10 + 0x20));
  if (sVar1 != 0x12) {
    *(undefined4 *)(*local_8 + 0x28) = 0x25;
    (**(code **)*local_8)(local_8);
  }
  return;
}

Assistant:

LOCAL(void)
write_header(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo, int num_colors)
/* Create and write a Targa header */
{
  char targaheader[18];

  /* Set unused fields of header to 0 */
  MEMZERO(targaheader, sizeof(targaheader));

  if (num_colors > 0) {
    targaheader[1] = 1;         /* color map type 1 */
    targaheader[5] = (char)(num_colors & 0xFF);
    targaheader[6] = (char)(num_colors >> 8);
    targaheader[7] = 24;        /* 24 bits per cmap entry */
  }

  targaheader[12] = (char)(cinfo->output_width & 0xFF);
  targaheader[13] = (char)(cinfo->output_width >> 8);
  targaheader[14] = (char)(cinfo->output_height & 0xFF);
  targaheader[15] = (char)(cinfo->output_height >> 8);
  targaheader[17] = 0x20;       /* Top-down, non-interlaced */

  if (cinfo->out_color_space == JCS_GRAYSCALE) {
    targaheader[2] = 3;         /* image type = uncompressed grayscale */
    targaheader[16] = 8;        /* bits per pixel */
  } else {                      /* must be RGB */
    if (num_colors > 0) {
      targaheader[2] = 1;       /* image type = colormapped RGB */
      targaheader[16] = 8;
    } else {
      targaheader[2] = 2;       /* image type = uncompressed RGB */
      targaheader[16] = 24;
    }
  }

  if (JFWRITE(dinfo->output_file, targaheader, 18) != (size_t)18)
    ERREXIT(cinfo, JERR_FILE_WRITE);
}